

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cmdline::parser::get<std::__cxx11::string>(parser *this,string *name)

{
  size_type sVar1;
  cmdline_error *pcVar2;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
  local_58;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  key_type *local_18;
  string *name_local;
  parser *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar1 == 0) {
    p._3_1_ = 1;
    pcVar2 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_38,"there is no flag: --",local_18);
    cmdline_error::cmdline_error(pcVar2,&local_38);
    p._3_1_ = 0;
    __cxa_throw(pcVar2,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
       ::find(&this->options,local_18);
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
           ::operator->(&local_58);
  if (ppVar3->second == (option_base *)0x0) {
    local_c0 = (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
  }
  else {
    local_c0 = (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__dynamic_cast(ppVar3->second,&option_base::typeinfo,
                                 &option_with_value<std::__cxx11::string>::typeinfo,0);
  }
  local_50 = local_c0;
  if (local_c0 ==
      (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    pcVar2 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_98,"type mismatch flag \'",local_18);
    std::operator+(&local_78,&local_98,"\'");
    cmdline_error::cmdline_error(pcVar2,&local_78);
    __cxa_throw(pcVar2,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  pbVar4 = option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(local_c0);
  return pbVar4;
}

Assistant:

const T &get(const std::string &name) const {
    if (options.count(name) == 0)
      throw cmdline_error("there is no flag: --" + name);
    const option_with_value<T> *p =
        dynamic_cast<const option_with_value<T> *>(options.find(name)->second);
    if (p == NULL) throw cmdline_error("type mismatch flag '" + name + "'");
    return p->get();
  }